

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# procs.hpp
# Opt level: O2

MPI_Comm __thiscall henson::ProcMap::intercomm(ProcMap *this,string *to,int tag)

{
  _Base_ptr p_Var1;
  undefined8 uVar2;
  undefined8 uVar3;
  MPI_Comm poVar4;
  int iVar5;
  int iVar6;
  iterator iVar7;
  mapped_type *pmVar8;
  long lVar9;
  MPI_Comm inter_comm;
  MPI_Comm intra_comm;
  MPI_Comm local_58;
  MPI_Comm local_50;
  string local_48;
  
  lVar9 = *(long *)(this + 8);
  do {
    if (lVar9 == *(long *)this) {
      uVar2 = *(undefined8 *)(*(long *)(this + 8) + -0x98);
      uVar3 = *(undefined8 *)(*(long *)(this + 8) + -0x90);
      iVar5 = leader(this,to);
      MPI_Intercomm_create(uVar3,0,uVar2,iVar5,tag,&local_58);
      iVar5 = leader(this,to);
      group_abi_cxx11_(&local_48,this);
      iVar6 = leader(this,&local_48);
      std::__cxx11::string::~string((string *)&local_48);
      MPI_Intercomm_merge(local_58,iVar5 < iVar6,&local_50);
      poVar4 = local_58;
      pmVar8 = std::
               map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_henson::ProcMap::InterIntraComm,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_henson::ProcMap::InterIntraComm>_>_>
               ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_henson::ProcMap::InterIntraComm,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_henson::ProcMap::InterIntraComm>_>_>
                             *)(*(long *)(this + 8) + -0x30),to);
      pmVar8->inter_comm = poVar4;
      pmVar8->intra_comm = local_50;
      return local_58;
    }
    iVar7 = std::
            _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_henson::ProcMap::InterIntraComm>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_henson::ProcMap::InterIntraComm>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_henson::ProcMap::InterIntraComm>_>_>
            ::find((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_henson::ProcMap::InterIntraComm>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_henson::ProcMap::InterIntraComm>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_henson::ProcMap::InterIntraComm>_>_>
                    *)(lVar9 + -0x30),to);
    p_Var1 = (_Base_ptr)(lVar9 + -0x28);
    lVar9 = lVar9 + -0x98;
  } while (iVar7._M_node == p_Var1);
  return *(MPI_Comm *)(iVar7._M_node + 2);
}

Assistant:

MPI_Comm    intercomm(const std::string& to, int tag = 0)
        {
            // It's necessary to cache intercomms: a puppet may call this
            // function multiple times (e.g., if it's restarted from scratch),
            // but subsequent calls to MPI_Intercomm_create cannot re-use the
            // same tag.

            // Search for the intercomm from the bottom up
            for (auto lit = levels_.rbegin(); lit != levels_.rend(); ++lit)
            {
                IntercommCache::const_iterator it = lit->intercomm_cache.find(to);
                if (it != lit->intercomm_cache.end())
                    return it->second.inter_comm;
            }

            // If not found, create the intercomm at the lowest level
            MPI_Comm inter_comm;
            MPI_Intercomm_create(local(), 0, world(), leader(to), tag, &inter_comm);

            MPI_Comm intra_comm;
            int remote_leader = leader(to);
            int local_leader  = leader(group());
            MPI_Intercomm_merge(inter_comm, local_leader > remote_leader, &intra_comm);

            level().intercomm_cache[to] = { inter_comm, intra_comm };

            return inter_comm;
        }